

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O1

void __thiscall
polyscope::CurveNetwork::CurveNetwork
          (CurveNetwork *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *nodes_,vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                  *edges_)

{
  ManagedBufferRegistry *registry_;
  undefined8 *puVar1;
  undefined1 *this_00;
  pointer pcVar2;
  pointer puVar3;
  ulong __val;
  ulong __val_00;
  pointer puVar4;
  bool bVar5;
  pointer pvVar6;
  char cVar7;
  char cVar8;
  long *plVar9;
  size_t sVar10;
  pointer paVar11;
  undefined8 *puVar12;
  size_type *psVar13;
  long *plVar14;
  ulong *puVar15;
  ulong uVar16;
  size_t sVar17;
  undefined8 uVar18;
  ulong uVar19;
  ulong __val_01;
  vec3 value_;
  string __str_3;
  string __str_2;
  string __str_1;
  string __str;
  string local_2f8;
  undefined **local_2d8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_2d0;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_2c8;
  string local_2c0;
  undefined1 *local_2a0;
  CurveNetwork *local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  string *local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_280;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_278;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_270;
  undefined8 *local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  ulong *local_248;
  uint local_240;
  undefined4 uStack_23c;
  ulong local_238 [2];
  ulong *local_228;
  uint local_220;
  undefined4 uStack_21c;
  ulong local_218 [2];
  ulong *local_208;
  uint local_200;
  undefined4 uStack_1fc;
  ulong local_1f8 [2];
  ulong *local_1e8;
  uint local_1e0;
  undefined4 uStack_1dc;
  ulong local_1d8 [2];
  undefined8 *local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong *local_188;
  long local_180;
  ulong local_178;
  long lStack_170;
  ulong *local_168;
  long local_160;
  ulong local_158;
  long lStack_150;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_128;
  string local_120;
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_100;
  ManagedBuffer<unsigned_int> *local_f8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_f0;
  ManagedBuffer<unsigned_int> *local_e8;
  string *local_e0;
  _Any_data local_d8;
  code *pcStack_c8;
  code *pcStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_278 = nodes_;
  WeakReferrable::WeakReferrable((WeakReferrable *)&this->field_0x950);
  (this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure =
       (_func_int **)0x5f8b28;
  *(undefined8 *)&this->field_0x950 = 0x5f8bc8;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_e0 = name;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
  (*(this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure[0xd])
            (&local_50,this);
  local_2d8 = &PTR_construction_vtable_24__005f8be0;
  QuantityStructure<polyscope::CurveNetwork>::QuantityStructure
            (&this->super_QuantityStructure<polyscope::CurveNetwork>,
             &PTR_construction_vtable_24__005f8be0,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure =
       (_func_int **)0x5f8b28;
  *(undefined8 *)&this->field_0x950 = 0x5f8bc8;
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  this_00 = &(this->super_QuantityStructure<polyscope::CurveNetwork>).field_0x428;
  registry_ = &(this->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure.
               super_ManagedBufferRegistry;
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar13) {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2f8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00,registry_,&local_2f8,
             &this->nodePositionsData);
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  local_f0 = &this->nodePositionsData;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar13) {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2f8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_280 = &this->edgeTailIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            (&this->edgeTailInds,registry_,&local_2f8,local_280);
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  local_e8 = &this->edgeTailInds;
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_f8 = &this->edgeTipInds;
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar13) {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2f8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_270 = &this->edgeTipIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer(local_f8,registry_,&local_2f8,local_270);
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar13) {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2f8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  pcStack_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = operator_new(0x18);
  local_2c8 = &this->edgeCenters;
  local_2d0 = &this->edgeCentersData;
  *(code **)local_d8._M_unused._0_8_ = computeEdgeCenters;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = 0;
  *(CurveNetwork **)((long)local_d8._M_unused._0_8_ + 0x10) = this;
  pcStack_c0 = std::
               _Function_handler<void_(),_std::_Bind<void_(polyscope::CurveNetwork::*(polyscope::CurveNetwork_*))()>_>
               ::_M_invoke;
  pcStack_c8 = std::
               _Function_handler<void_(),_std::_Bind<void_(polyscope::CurveNetwork::*(polyscope::CurveNetwork_*))()>_>
               ::_M_manager;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_2c8,registry_,&local_2f8,local_2d0,(function<void_()> *)&local_d8);
  if (pcStack_c8 != (code *)0x0) {
    (*pcStack_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  local_128 = &this->nodeDegrees;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar6 = (local_278->
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->nodePositionsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (local_278->
       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->nodePositionsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar6;
  (this->nodePositionsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (local_278->
       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_278->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_278->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_278->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_280 + 2))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [64])local_280 = ZEXT464(0) << 0x40;
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar13) {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2f8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  value_ = getNextUniqueColor();
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->color,&local_2f8,value_);
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar13) {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar13;
    local_2f8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2f8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  PersistentValue<polyscope::ScaledValue<float>_>::PersistentValue
            (&this->radius,&local_2f8,(ScaledValue<float>)0x3ba3d70a00000001);
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_2c0,(Structure *)this);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_2f8.field_2._M_allocated_capacity = *plVar14;
    local_2f8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *plVar14;
    local_2f8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2f8._M_string_length = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clay","");
  local_100 = &this->material;
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::PersistentValue(local_100,&local_2f8,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  local_288 = &this->nodeRadiusQuantityName;
  local_290 = &(this->nodeRadiusQuantityName).field_2;
  (this->edgeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->edgeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->nodeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->edgePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->edgePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->nodePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodeRadiusQuantityName)._M_dataplus._M_p = (pointer)local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
  this->nodeRadiusQuantityAutoscale = true;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (local_280,
             (long)(edges_->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(edges_->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (local_270,
             (long)(edges_->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(edges_->
                   super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  sVar10 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                     ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00);
  local_2c0._M_dataplus._M_p = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f8,sVar10,
             (value_type_conflict1 *)&local_2c0,(allocator_type *)&local_268);
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_2f8.field_2._M_allocated_capacity;
  puVar3 = (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_2f8._M_dataplus._M_p;
  (this->nodeDegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_2f8._M_string_length;
  local_2f8._0_16_ = ZEXT816(0) << 0x20;
  local_2f8.field_2._M_allocated_capacity = 0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  if (local_2f8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  local_2a0 = this_00;
  sVar10 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                     ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00);
  paVar11 = (edges_->
            super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_298 = this;
  local_278 = (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)edges_;
  if ((edges_->
      super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != paVar11) {
    __val_01 = 0;
    do {
      __val = paVar11[__val_01]._M_elems[0];
      __val_00 = paVar11[__val_01]._M_elems[1];
      (local_280->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[__val_01] = (uint)__val;
      (local_270->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[__val_01] = (uint)__val_00;
      if (sVar10 <= __val || sVar10 <= __val_00) {
        std::operator+(&local_b0,"CurveNetwork [",local_e0);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_188 = &local_178;
        puVar15 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar15) {
          local_178 = *puVar15;
          lStack_170 = plVar9[3];
        }
        else {
          local_178 = *puVar15;
          local_188 = (ulong *)*plVar9;
        }
        local_180 = plVar9[1];
        *plVar9 = (long)puVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        cVar8 = '\x01';
        if (9 < __val_01) {
          uVar16 = __val_01;
          cVar7 = '\x04';
          do {
            cVar8 = cVar7;
            if (uVar16 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_00260676;
            }
            if (uVar16 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_00260676;
            }
            if (uVar16 < 10000) goto LAB_00260676;
            bVar5 = 99999 < uVar16;
            uVar16 = uVar16 / 10000;
            cVar7 = cVar8 + '\x04';
          } while (bVar5);
          cVar8 = cVar8 + '\x01';
        }
LAB_00260676:
        local_1e8 = local_1d8;
        std::__cxx11::string::_M_construct((ulong)&local_1e8,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1e8,local_1e0,__val_01);
        uVar16 = 0xf;
        if (local_188 != &local_178) {
          uVar16 = local_178;
        }
        uVar19 = CONCAT44(uStack_1dc,local_1e0) + local_180;
        if (uVar16 < uVar19) {
          uVar16 = 0xf;
          if (local_1e8 != local_1d8) {
            uVar16 = local_1d8[0];
          }
          if (uVar16 < uVar19) goto LAB_0026070d;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_188);
        }
        else {
LAB_0026070d:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1e8);
        }
        local_1c8 = &local_1b8;
        puVar1 = puVar12 + 2;
        if ((undefined8 *)*puVar12 == puVar1) {
          local_1b8 = *puVar1;
          uStack_1b0 = puVar12[3];
        }
        else {
          local_1b8 = *puVar1;
          local_1c8 = (undefined8 *)*puVar12;
        }
        local_1c0 = puVar12[1];
        *puVar12 = puVar1;
        puVar12[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        local_168 = &local_158;
        puVar15 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar15) {
          local_158 = *puVar15;
          lStack_150 = plVar9[3];
        }
        else {
          local_158 = *puVar15;
          local_168 = (ulong *)*plVar9;
        }
        local_160 = plVar9[1];
        *plVar9 = (long)puVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        cVar8 = '\x01';
        if (9 < __val) {
          uVar16 = __val;
          cVar7 = '\x04';
          do {
            cVar8 = cVar7;
            if (uVar16 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_00260848;
            }
            if (uVar16 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_00260848;
            }
            if (uVar16 < 10000) goto LAB_00260848;
            bVar5 = 99999 < uVar16;
            uVar16 = uVar16 / 10000;
            cVar7 = cVar8 + '\x04';
          } while (bVar5);
          cVar8 = cVar8 + '\x01';
        }
LAB_00260848:
        local_208 = local_1f8;
        std::__cxx11::string::_M_construct((ulong)&local_208,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_208,local_200,__val);
        uVar16 = 0xf;
        if (local_168 != &local_158) {
          uVar16 = local_158;
        }
        uVar19 = CONCAT44(uStack_1fc,local_200) + local_160;
        if (uVar16 < uVar19) {
          uVar16 = 0xf;
          if (local_208 != local_1f8) {
            uVar16 = local_1f8[0];
          }
          if (uVar16 < uVar19) goto LAB_002608df;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_168);
        }
        else {
LAB_002608df:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_208);
        }
        local_1a8 = &local_198;
        puVar1 = puVar12 + 2;
        if ((undefined8 *)*puVar12 == puVar1) {
          local_198 = *puVar1;
          uStack_190 = puVar12[3];
        }
        else {
          local_198 = *puVar1;
          local_1a8 = (undefined8 *)*puVar12;
        }
        local_1a0 = puVar12[1];
        *puVar12 = puVar1;
        puVar12[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_1a8);
        local_148 = &local_138;
        puVar15 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar15) {
          local_138 = *puVar15;
          lStack_130 = plVar9[3];
        }
        else {
          local_138 = *puVar15;
          local_148 = (ulong *)*plVar9;
        }
        local_140 = plVar9[1];
        *plVar9 = (long)puVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        cVar8 = '\x01';
        if (9 < __val_00) {
          uVar16 = __val_00;
          cVar7 = '\x04';
          do {
            cVar8 = cVar7;
            if (uVar16 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_00260a1a;
            }
            if (uVar16 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_00260a1a;
            }
            if (uVar16 < 10000) goto LAB_00260a1a;
            bVar5 = 99999 < uVar16;
            uVar16 = uVar16 / 10000;
            cVar7 = cVar8 + '\x04';
          } while (bVar5);
          cVar8 = cVar8 + '\x01';
        }
LAB_00260a1a:
        local_228 = local_218;
        std::__cxx11::string::_M_construct((ulong)&local_228,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_228,local_220,__val_00);
        uVar16 = 0xf;
        if (local_148 != &local_138) {
          uVar16 = local_138;
        }
        uVar19 = CONCAT44(uStack_21c,local_220) + local_140;
        if (uVar16 < uVar19) {
          uVar16 = 0xf;
          if (local_228 != local_218) {
            uVar16 = local_218[0];
          }
          if (uVar16 < uVar19) goto LAB_00260ab1;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_148);
        }
        else {
LAB_00260ab1:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_228);
        }
        local_268 = &local_258;
        puVar1 = puVar12 + 2;
        if ((undefined8 *)*puVar12 == puVar1) {
          local_258 = *puVar1;
          uStack_250 = puVar12[3];
        }
        else {
          local_258 = *puVar1;
          local_268 = (undefined8 *)*puVar12;
        }
        local_260 = puVar12[1];
        *puVar12 = puVar1;
        puVar12[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_268);
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        puVar15 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_2c0.field_2._M_allocated_capacity = *puVar15;
          local_2c0.field_2._8_8_ = plVar9[3];
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *puVar15;
          local_2c0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_2c0._M_string_length = plVar9[1];
        *plVar9 = (long)puVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        cVar8 = '\x01';
        if (9 < sVar10) {
          sVar17 = sVar10;
          cVar7 = '\x04';
          do {
            cVar8 = cVar7;
            if (sVar17 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_00260bdd;
            }
            if (sVar17 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_00260bdd;
            }
            if (sVar17 < 10000) goto LAB_00260bdd;
            bVar5 = 99999 < sVar17;
            sVar17 = sVar17 / 10000;
            cVar7 = cVar8 + '\x04';
          } while (bVar5);
          cVar8 = cVar8 + '\x01';
        }
LAB_00260bdd:
        local_248 = local_238;
        std::__cxx11::string::_M_construct((ulong)&local_248,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_248,local_240,sVar10);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          uVar18 = local_2c0.field_2._M_allocated_capacity;
        }
        uVar16 = CONCAT44(uStack_23c,local_240) + local_2c0._M_string_length;
        if ((ulong)uVar18 < uVar16) {
          uVar19 = 0xf;
          if (local_248 != local_238) {
            uVar19 = local_238[0];
          }
          if (uVar19 < uVar16) goto LAB_00260c68;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_248,0,(char *)0x0,(ulong)local_2c0._M_dataplus._M_p);
        }
        else {
LAB_00260c68:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_248);
        }
        local_2f8._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
        psVar13 = puVar12 + 2;
        if ((size_type *)*puVar12 == psVar13) {
          local_2f8.field_2._M_allocated_capacity = *psVar13;
          local_2f8.field_2._8_8_ = puVar12[3];
        }
        else {
          local_2f8.field_2._M_allocated_capacity = *psVar13;
          local_2f8._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_2f8._M_string_length = puVar12[1];
        *puVar12 = psVar13;
        puVar12[1] = 0;
        *(undefined1 *)psVar13 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_2f8);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        psVar13 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_120.field_2._M_allocated_capacity = *psVar13;
          local_120.field_2._8_8_ = plVar9[3];
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar13;
          local_120._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_120._M_string_length = plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        exception(&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if (local_2f8._M_dataplus._M_p != (pointer)((long)&local_2f8 + 0x10)) {
          operator_delete(local_2f8._M_dataplus._M_p);
        }
        if (local_248 != local_238) {
          operator_delete(local_248);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268);
        }
        if (local_228 != local_218) {
          operator_delete(local_228);
        }
        if (local_148 != &local_138) {
          operator_delete(local_148);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8);
        }
        if (local_208 != local_1f8) {
          operator_delete(local_208);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168);
        }
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8);
        }
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8);
        }
        if (local_188 != &local_178) {
          operator_delete(local_188);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      puVar4 = (local_128->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = puVar4 + __val;
      *puVar3 = *puVar3 + 1;
      puVar4 = puVar4 + __val_00;
      *puVar4 = *puVar4 + 1;
      __val_01 = __val_01 + 1;
      paVar11 = (((_Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                   *)&local_278->
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 )->_M_impl).super__Vector_impl_data._M_start;
    } while (__val_01 <
             (ulong)((long)(((_Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                              *)&local_278->
                                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            )->_M_impl).super__Vector_impl_data._M_finish - (long)paVar11 >> 4));
  }
  (*(local_298->super_QuantityStructure<polyscope::CurveNetwork>).super_Structure._vptr_Structure
    [0x10])(local_298);
  return;
}

Assistant:

CurveNetwork::CurveNetwork(std::string name, std::vector<glm::vec3> nodes_, std::vector<std::array<size_t, 2>> edges_)
    : // clang-format off
      QuantityStructure<CurveNetwork>(name, typeName()), 
      nodePositions(this, uniquePrefix() + "nodePositions", nodePositionsData),
      edgeTailInds(this, uniquePrefix() + "edgeTailInds", edgeTailIndsData),
      edgeTipInds(this, uniquePrefix() + "edgeTipInds", edgeTipIndsData),
      edgeCenters(this, uniquePrefix() + "edgeCenters", edgeCentersData, std::bind(&CurveNetwork::computeEdgeCenters, this)),         
      nodePositionsData(std::move(nodes_)), 
      color(uniquePrefix() + "#color", getNextUniqueColor()), 
      radius(uniquePrefix() + "#radius", relativeValue(0.005)),
      material(uniquePrefix() + "#material", "clay")
// clang-format on
{

  // Copy interleaved data in to tip and tails buffers below
  edgeTailIndsData.resize(edges_.size());
  edgeTipIndsData.resize(edges_.size());

  // Compute node degrees; some quantities want them for visualizations
  nodeDegrees = std::vector<size_t>(nNodes(), 0);

  size_t maxInd = nodePositions.size();
  for (size_t iE = 0; iE < edges_.size(); iE++) {
    auto edge = edges_[iE];
    size_t nA = std::get<0>(edge);
    size_t nB = std::get<1>(edge);

    edgeTailIndsData[iE] = nA;
    edgeTipIndsData[iE] = nB;

    // Make sure there are no out of bounds indices
    if (nA >= maxInd || nB >= maxInd) {
      exception("CurveNetwork [" + name + "] edge " + std::to_string(iE) + " has bad node indices { " +
                std::to_string(nA) + " , " + std::to_string(nB) + " } but there are " + std::to_string(maxInd) +
                " nodes.");
    }

    // Increment degree
    nodeDegrees[nA]++;
    nodeDegrees[nB]++;
  }

  updateObjectSpaceBounds();
}